

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CFrame::ExternalCall
          (CFrame *this,string *functionName,
          unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
          *args)

{
  CExpressionList *pCVar1;
  CCallExpression *this_00;
  CNameExpression *this_01;
  long *in_RCX;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CNameExpression_*,_false> local_78;
  string local_70;
  CLabel local_50;
  
  this_00 = (CCallExpression *)operator_new(0x18);
  this_01 = (CNameExpression *)operator_new(0x28);
  pCVar1 = (args->_M_t).
           super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
           .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pCVar1,
             (long)&((args[1]._M_t.
                      super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
                      .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl)->
                    super_IExpression).super_INode._vptr_INode + (long)pCVar1);
  CLabel::CLabel(&local_50,&local_70);
  CNameExpression::CNameExpression(this_01,&local_50);
  local_80._M_head_impl = (CExpressionList *)*in_RCX;
  *in_RCX = 0;
  local_78._M_head_impl = this_01;
  CCallExpression::CCallExpression
            (this_00,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                      *)&local_78,
             (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
              *)&local_80);
  (this->className)._M_dataplus._M_p = (pointer)this_00;
  if (local_80._M_head_impl != (CExpressionList *)0x0) {
    (*((local_80._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_80._M_head_impl = (CExpressionList *)0x0;
  if (local_78._M_head_impl != (CNameExpression *)0x0) {
    (*((local_78._M_head_impl)->super_CExpression).super_IExpression.super_INode._vptr_INode[2])();
  }
  local_78._M_head_impl = (CNameExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label._M_dataplus._M_p != &local_50.label.field_2) {
    operator_delete(local_50.label._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CExpression>
CFrame::ExternalCall(const std::string &functionName, std::unique_ptr<const CExpressionList> args) const {
    return std::move(std::unique_ptr<const CExpression>(
            new CCallExpression(
                    std::move(std::unique_ptr<const CNameExpression>(
                            new CNameExpression(CLabel(functionName))
                    )),
                    std::move(args)
            )
    ));
}